

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderBeamIGA::BuildBeam
          (ChBuilderBeamIGA *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,ChLineBspline *spline,
          ChVector<double> *Ydir)

{
  ChMesh *pCVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  double dVar5;
  long lVar6;
  ulong uVar7;
  ChNodeFEAxyzrot *this_00;
  pointer pCVar8;
  double *__args;
  ChVector<double> *mv;
  ulong uVar9;
  _func_int **pp_Var10;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> hnode_i;
  ChMatrix33<double> mrot;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  mynodes;
  ChVector<double> mX;
  ChVector<double> pos;
  ChVector<double> tangent;
  ChVector<double> mY;
  long local_2a8;
  long local_2a0;
  ChVector<double> local_298;
  ulong local_278;
  _func_int **local_270;
  ulong local_268;
  ulong local_260;
  shared_ptr<chrono::fea::ChMesh> *local_258;
  shared_ptr<chrono::fea::ChElementBase> local_250;
  element_type *local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_230;
  ChMatrix33<double> local_220;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_1d8;
  ChBuilderBeamIGA *local_1c0;
  shared_ptr<chrono::fea::ChBeamSectionCosserat> *local_1b8;
  vector<double,_std::allocator<double>_> local_1b0;
  ChFrame<double> local_198;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_108;
  ChVector<double> local_f0;
  ChVector<double> local_d8;
  ChFrame<double> local_b8;
  
  local_258 = mesh;
  local_1b8 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ::clear(&this->beam_elems);
  local_1c0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(&this->beam_nodes);
  local_268 = (ulong)(uint)spline->p;
  uVar4 = spline->p * 2;
  local_260 = (ulong)uVar4;
  local_278 = CONCAT44(local_278._4_4_,
                       ~uVar4 + (int)(spline->knots).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows);
  local_1d8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar8 = (spline->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(spline->points).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8;
  if (lVar6 != 0) {
    uVar7 = (lVar6 >> 3) * -0x5555555555555555;
    lVar6 = 0x10;
    local_270 = (_func_int **)&PTR__ChFrame_00b2b308;
    uVar9 = 0;
    do {
      local_f0.m_data[0] = *(double *)((long)pCVar8->m_data + lVar6 + -0x10);
      local_f0.m_data[1] = *(double *)((long)pCVar8->m_data + lVar6 + -8);
      local_f0.m_data[2] = *(double *)((long)pCVar8->m_data + lVar6);
      auVar2._8_8_ = in_XMM4_Qb;
      auVar2._0_8_ = in_XMM4_Qa;
      vcvtusi2sd_avx512f(auVar2,uVar7 - 1);
      local_d8.m_data[0] = 0.0;
      local_d8.m_data[1] = 0.0;
      local_d8.m_data[2] = 0.0;
      (*(spline->super_ChLine).super_ChGeometry._vptr_ChGeometry[0xc])(spline,&local_d8);
      local_198._vptr_ChFrame = (_func_int **)0x0;
      local_198.coord.pos.m_data[0] = 0.0;
      local_198.coord.pos.m_data[1] = 0.0;
      local_b8.coord.pos.m_data[1] = 0.0;
      local_b8._vptr_ChFrame = (_func_int **)0x0;
      local_b8.coord.pos.m_data[0] = 0.0;
      local_298.m_data[2] = 0.0;
      local_298.m_data[0] = 0.0;
      local_298.m_data[1] = 0.0;
      ChVector<double>::DirToDxDyDz
                (&local_d8,(ChVector<double> *)&local_198,(ChVector<double> *)&local_b8,&local_298,
                 Ydir);
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_198._vptr_ChFrame;
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_b8._vptr_ChFrame;
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_298.m_data[0];
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_198.coord.pos.m_data[0];
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_b8.coord.pos.m_data[0];
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_298.m_data[1];
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_198.coord.pos.m_data[1];
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_b8.coord.pos.m_data[1];
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_298.m_data[2];
      mv = &local_f0;
      ChFrame<double>::ChFrame(&local_b8,mv,&local_220);
      this_00 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
      local_198._vptr_ChFrame = local_270;
      local_198.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
      local_198.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
      local_198.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
      local_198.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
      local_198.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
      local_198.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
      local_198.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_00,&local_198);
      local_298.m_data[0] = (double)this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.m_data + 1),this_00);
      pCVar1 = (local_258->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_230.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_298.m_data[0];
      local_230.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
        }
      }
      ChMesh::AddNode(pCVar1,&local_230);
      if (local_230.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_230.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(&local_1d8,(value_type *)&local_298);
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(&this->beam_nodes,(value_type *)&local_298);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1]);
      }
      uVar9 = uVar9 + 1;
      pCVar8 = (spline->points).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(spline->points).
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 3) *
              -0x5555555555555555;
      lVar6 = lVar6 + 0x18;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  if (0 < (int)local_278) {
    iVar3 = (int)local_260;
    local_270 = (_func_int **)(ulong)((int)local_268 + 1);
    local_278 = local_278 & 0xffffffff;
    local_2a0 = 0;
    local_2a8 = 0;
    uVar7 = 0;
    do {
      local_198._vptr_ChFrame = (_func_int **)0x0;
      local_198.coord.pos.m_data[0] = 0.0;
      local_198.coord.pos.m_data[1] = 0.0;
      if (-2 < (int)local_260) {
        uVar9 = 0;
        lVar6 = local_2a8;
        do {
          if ((spline->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= (long)(uVar7 + uVar9)) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          __args = (double *)
                   ((long)(spline->knots).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + lVar6);
          if (local_198.coord.pos.m_data[0] == local_198.coord.pos.m_data[1]) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_198,
                       (iterator)local_198.coord.pos.m_data[0],__args);
          }
          else {
            *(double *)local_198.coord.pos.m_data[0] = *__args;
            local_198.coord.pos.m_data[0] = (double)((long)local_198.coord.pos.m_data[0] + 8);
          }
          uVar9 = uVar9 + 1;
          lVar6 = lVar6 + 8;
        } while (iVar3 + 2 != uVar9);
      }
      local_b8._vptr_ChFrame = (_func_int **)0x0;
      local_b8.coord.pos.m_data[0] = 0.0;
      local_b8.coord.pos.m_data[1] = 0.0;
      lVar6 = local_2a0;
      pp_Var10 = local_270;
      if (-1 < (int)local_268) {
        do {
          std::
          vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       *)&local_b8,
                      (value_type *)
                      ((long)&((local_1d8.
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + lVar6));
          lVar6 = lVar6 + 0x10;
          pp_Var10 = (_func_int **)((long)pp_Var10 - 1);
        } while (pp_Var10 != (_func_int **)0x0);
      }
      local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamIGA,std::allocator<chrono::fea::ChElementBeamIGA>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 1),(ChElementBeamIGA **)&local_220,
                 (allocator<chrono::fea::ChElementBeamIGA> *)&local_298);
      dVar5 = local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
      ;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::vector(&local_108,
               (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                *)&local_b8);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_1b0,(vector<double,_std::allocator<double>_> *)&local_198);
      (*(*(_func_int ***)dVar5)[0x1c])(dVar5,&local_108,&local_1b0,local_268);
      if (local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector(&local_108);
      local_240 = (local_1b8->
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_238._M_pi =
           (local_1b8->
           super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_238._M_pi)->_M_use_count = (local_238._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_238._M_pi)->_M_use_count = (local_238._M_pi)->_M_use_count + 1;
        }
      }
      ((element_type *)
      ((long)local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
      + 0x188))->_vptr_ChElementBase = (_func_int **)local_240;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[0] + 400),&local_238);
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
      }
      pCVar1 = (local_258->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_250.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_250.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] + 8) =
               *(_Atomic_word *)
                ((long)local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] + 8) =
               *(_Atomic_word *)
                ((long)local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar1,&local_250);
      if (local_250.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_250.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
      ::push_back(&local_1c0->beam_elems,(value_type *)&local_220);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_220.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1]);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 *)&local_b8);
      if (local_198._vptr_ChFrame != (_func_int **)0x0) {
        operator_delete(local_198._vptr_ChFrame,
                        (long)local_198.coord.pos.m_data[1] - (long)local_198._vptr_ChFrame);
      }
      uVar7 = uVar7 + 1;
      local_2a8 = local_2a8 + 8;
      local_2a0 = local_2a0 + 0x10;
    } while (uVar7 != local_278);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::~vector(&local_1d8);
  return;
}

Assistant:

void ChBuilderBeamIGA::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                 std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                 geometry::ChLineBspline& spline,  // the B-spline to be used as the centerline
                                 const ChVector<> Ydir             // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    int p = spline.GetOrder();

    // compute N of spans (excluding start and end multiple knots with zero lenght span):
    int N = (int)spline.Knots().size() - p - p - 1;  // = n+p+1 -p-p-1 = n-p

    // Create the 'complete' stl vector of control points, with uniform distribution
    std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes;
    for (int i_node = 0; i_node < spline.Points().size(); ++i_node) {
        double abscyssa = ((double)i_node / (double)(spline.Points().size() - 1));

        // position of node
        ChVector<> pos = spline.Points()[i_node];

        // rotation of node, x aligned to tangent at input spline
        ChMatrix33<> mrot;
        ChVector<> tangent;
        spline.Derive(tangent, abscyssa);
        mrot.Set_A_Xdir(tangent, Ydir);

        auto hnode_i = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(hnode_i);
        mynodes.push_back(hnode_i);
        this->beam_nodes.push_back(hnode_i);
    }

    // Create the single elements by picking a subset of the nodes and control points
    for (int i_el = 0; i_el < N; ++i_el) {
        std::vector<double> my_el_knots;
        for (int i_el_knot = 0; i_el_knot < p + p + 1 + 1; ++i_el_knot) {
            my_el_knots.push_back(spline.Knots()(i_el + i_el_knot));
        }

        std::vector<std::shared_ptr<ChNodeFEAxyzrot>> my_el_nodes;
        for (int i_el_node = 0; i_el_node < p + 1; ++i_el_node) {
            my_el_nodes.push_back(mynodes[i_el + i_el_node]);
        }

        auto belement_i = chrono_types::make_shared<ChElementBeamIGA>();
        belement_i->SetNodesGenericOrder(my_el_nodes, my_el_knots, p);
        belement_i->SetSection(sect);
        mesh->AddElement(belement_i);
        this->beam_elems.push_back(belement_i);
    }
}